

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_peak2_init_preallocated(ma_peak2_config *pConfig,void *pHeap,ma_peak2 *pFilter)

{
  void *in_RDX;
  undefined4 *in_RDI;
  ma_biquad *pBQ;
  void *pHeap_00;
  ma_biquad_config *pConfig_00;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  ma_result result;
  double A;
  double a;
  double c;
  double s;
  double w;
  double q;
  undefined4 local_108;
  undefined4 local_104;
  double local_100;
  double local_f8;
  double local_f0;
  undefined1 local_d0 [80];
  undefined4 *local_80;
  ma_result local_74;
  undefined8 local_70;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined4 *local_30;
  double local_28;
  undefined8 local_20;
  double local_18;
  double local_10;
  double local_8;
  
  if (in_RDX == (void *)0x0) {
    local_74 = MA_INVALID_ARGS;
  }
  else {
    local_70 = 0x40;
    local_80 = in_RDI;
    if (in_RDX != (void *)0x0) {
      memset(in_RDX,0,0x40);
    }
    if (local_80 == (undefined4 *)0x0) {
      local_74 = MA_INVALID_ARGS;
    }
    else {
      local_30 = local_80;
      local_38 = *(double *)(local_80 + 6);
      local_40 = (*(double *)(local_80 + 8) * 6.283185307179586) / (double)(uint)local_80[2];
      local_18 = local_40;
      local_48 = sin(local_40);
      local_10 = local_40;
      local_8 = 1.5707963267948966 - local_40;
      local_50 = sin(local_8);
      local_58 = local_48 / (local_38 * 2.0);
      local_28 = *(double *)(local_30 + 4) / 40.0;
      local_20 = 0x4024000000000000;
      local_60 = pow(10.0,local_28);
      local_100 = local_58 * local_60 + 1.0;
      local_f8 = local_50 * -2.0;
      local_f0 = -local_58 * local_60 + 1.0;
      pBQ = (ma_biquad *)(local_58 / local_60 + 1.0);
      pHeap_00 = (void *)(local_50 * -2.0);
      pConfig_00 = (ma_biquad_config *)(1.0 - local_58 / local_60);
      local_108 = *local_30;
      local_104 = local_30[1];
      memcpy(local_d0,&local_108,0x38);
      local_74 = ma_biquad_init_preallocated(pConfig_00,pHeap_00,pBQ);
      if (local_74 == MA_SUCCESS) {
        local_74 = MA_SUCCESS;
      }
    }
  }
  return local_74;
}

Assistant:

MA_API ma_result ma_peak2_init_preallocated(const ma_peak2_config* pConfig, void* pHeap, ma_peak2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFilter);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_peak2__get_biquad_config(pConfig);
    result = ma_biquad_init_preallocated(&bqConfig, pHeap, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}